

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

int64_t duckdb::DatePart::TimezoneHourOperator::Operation<duckdb::date_t,long>(date_t input)

{
  NotImplementedException *this;
  allocator local_39;
  string local_38 [32];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"\"date\" units \"timezone_hour\" not recognized",&local_39)
  ;
  duckdb::NotImplementedException::NotImplementedException(this,local_38);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int64_t DatePart::TimezoneHourOperator::Operation(date_t input) {
	throw NotImplementedException("\"date\" units \"timezone_hour\" not recognized");
}